

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O2

void lj_ir_rollback(jit_State *J,IRRef ref)

{
  IRIns *pIVar1;
  ulong uVar2;
  
  for (uVar2 = (ulong)(J->cur).nins; ref < uVar2; uVar2 = uVar2 - 1) {
    pIVar1 = (J->cur).ir;
    J->chain[*(byte *)((long)pIVar1 + uVar2 * 8 + -3)] = *(IRRef1 *)((long)pIVar1 + uVar2 * 8 + -2);
  }
  (J->cur).nins = (IRRef)uVar2;
  return;
}

Assistant:

void lj_ir_rollback(jit_State *J, IRRef ref)
{
  IRRef nins = J->cur.nins;
  while (nins > ref) {
    IRIns *ir;
    nins--;
    ir = IR(nins);
    J->chain[ir->o] = ir->prev;
  }
  J->cur.nins = nins;
}